

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_c382::TextureWriterTestHelper<unsigned_char,_4U,_32856U>::compareTexture2Images
          (TextureWriterTestHelper<unsigned_char,_4U,_32856U> *this,ktx_uint8_t *pData)

{
  uint uVar1;
  uint uVar2;
  pointer pvVar3;
  pointer pvVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  void *__s1;
  byte bVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  float fVar16;
  float fVar17;
  
  pvVar3 = (this->super_WriterTestHelper<unsigned_char,_4U,_32856U>).images.
           super__Vector_base<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar1 = (this->super_WriterTestHelper<unsigned_char,_4U,_32856U>).width;
  uVar2 = (this->super_WriterTestHelper<unsigned_char,_4U,_32856U>).height;
  uVar11 = ((long)(this->super_WriterTestHelper<unsigned_char,_4U,_32856U>).images.
                  super__Vector_base<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) / 0x18 & 0xffffffff;
  while (iVar9 = (int)uVar11, 0 < iVar9) {
    uVar11 = uVar11 - 1;
    bVar8 = (byte)uVar11 & 0x1f;
    uVar15 = (ulong)((uVar1 >> bVar8) * 4);
    if (uVar1 >> bVar8 == 0) {
      uVar15 = 4;
    }
    uVar14 = uVar2 >> ((byte)uVar11 & 0x1f);
    uVar15 = (uVar14 + (uVar14 == 0)) * uVar15;
    pvVar4 = *(pointer *)
              ((long)&(pvVar3->
                      super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                      )._M_impl.super__Vector_impl_data + 8);
    lVar5 = *(long *)&(pvVar3->
                      super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                      )._M_impl.super__Vector_impl_data;
    for (uVar14 = 0; (ulong)uVar14 < (ulong)(((long)pvVar4 - lVar5) / 0x18); uVar14 = uVar14 + 1) {
      lVar6 = *(long *)&pvVar3[uVar11 & 0xffffffff].
                        super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                        ._M_impl;
      lVar12 = (ulong)uVar14 * 0x18;
      lVar7 = *(long *)(lVar6 + lVar12);
      lVar6 = *(long *)(lVar6 + 8 + lVar12);
      for (uVar13 = 0; (ulong)uVar13 < (ulong)((lVar6 - lVar7) / 0x18); uVar13 = uVar13 + 1) {
        lVar12 = (ulong)uVar13 * 0x18;
        __s1 = *(void **)(lVar7 + lVar12);
        iVar10 = bcmp(__s1,pData,*(long *)(lVar7 + 8 + lVar12) - (long)__s1);
        if (iVar10 != 0) goto LAB_00124166;
        pData = pData + uVar15;
      }
    }
    fVar16 = (float)uVar15;
    fVar17 = ceilf(fVar16 * 0.25);
    pData = pData + ((long)(fVar17 * 4.0 - fVar16) & 0xffffffff);
  }
LAB_00124166:
  return iVar9 < 1;
}

Assistant:

bool
    compareTexture2Images(ktx_uint8_t* pData)
    {
        for (ktx_int32_t level = (ktx_int32_t)images.size() - 1; level >= 0; level--) {
            ktx_uint32_t levelWidth = MAX(1, width >> level);
            ktx_uint32_t levelHeight = MAX(1, height >> level);
            ktx_uint32_t texelBlockSize = sizeof(component_type) * numComponents;
            ktx_uint32_t requiredLevelAlignment = lcm4(texelBlockSize);
            ktx_size_t rowBytes = levelWidth * texelBlockSize;
            ktx_size_t imageBytes = rowBytes * levelHeight;
            for (ktx_uint32_t layer = 0; layer < images[0].size(); layer++) {
                for (ktx_uint32_t faceSlice = 0; faceSlice < images[level][layer].size(); faceSlice++) {
                    if (memcmp(images[level][layer][faceSlice].data(), pData,
                               images[level][layer][faceSlice].size() * sizeof(component_type)))
                        return false;
                    pData += imageBytes;
                }
            }
            pData += _KTX_PADN_LEN(requiredLevelAlignment, imageBytes);
        }
        return true;
    }